

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O2

void convertMe(void)

{
  process();
  processSecond();
  process();
  return;
}

Assistant:

void convertMe()
{
    Partner* pFirst = new Partner();

    if (!process())
    {
        delete pFirst;
        return;
    }

    Partner* pSecond = new Partner();

    if (!processSecond())
    {
        delete pFirst;
        delete pSecond;
        return;
    }

    process();
    delete pFirst;
    delete pSecond;
}